

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_cast(lua_State *L)

{
  long *plVar1;
  CTypeID CVar2;
  uint uVar3;
  TValue *o;
  void *pvVar4;
  ulong uVar5;
  CTState *cts;
  CType *d;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  CVar2 = ffi_checkctype(L,cts,(TValue *)0x0);
  d = cts->tab + CVar2;
  o = lj_lib_checkany(L,2);
  L->top = o + 1;
  if (((0xfffffff < d->info) && (uVar3 = d->info >> 0x1c, uVar3 != 2)) && (uVar3 != 5)) {
    lj_err_arg(L,1,LJ_ERR_FFI_INVTYPE);
  }
  if (((o->field_2).it != 0xfffffff5) || (CVar2 != *(ushort *)((ulong)(o->u32).lo + 6))) {
    pvVar4 = lj_mem_newgco(cts->L,d->size + 8);
    *(undefined1 *)((long)pvVar4 + 5) = 10;
    *(short *)((long)pvVar4 + 6) = (short)CVar2;
    plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
    *plVar1 = *plVar1 + 1;
    lj_cconv_ct_tv(cts,d,(uint8_t *)((long)pvVar4 + 8),o,1);
    (o->u32).lo = (uint32_t)pvVar4;
    (o->field_2).it = 0xfffffff5;
    uVar5 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar5 + 0x54) <= *(uint *)(uVar5 + 0x50)) {
      lj_gc_step(L);
    }
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_cast)	LJLIB_REC(ffi_new)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CType *d = ctype_raw(cts, id);
  TValue *o = lj_lib_checkany(L, 2);
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  if (!(ctype_isnum(d->info) || ctype_isptr(d->info) || ctype_isenum(d->info)))
    lj_err_arg(L, 1, LJ_ERR_FFI_INVTYPE);
  if (!(tviscdata(o) && cdataV(o)->ctypeid == id)) {
    GCcdata *cd = lj_cdata_new(cts, id, d->size);
    lj_cconv_ct_tv(cts, d, cdataptr(cd), o, CCF_CAST);
    setcdataV(L, o, cd);
    lj_gc_check(L);
  }
  return 1;
}